

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::AlternativePass0
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,int depth)

{
  bool bVar1;
  int depth_local;
  Parser<UTF8EncodingPolicyBase<false>,_false> *this_local;
  
  while( true ) {
    bVar1 = IsEndOfAlternative(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    TermPass0(this,depth);
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>::AlternativePass0(int depth)
    {
        while (!IsEndOfAlternative())
            TermPass0(depth);
    }